

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i2cdev.cpp
# Opt level: O2

int8_t __thiscall
I2Cdev::readBitsW(I2Cdev *this,uint8_t regAddr,uint8_t bitStart,uint8_t length,uint16_t *data,
                 uint16_t timeout)

{
  int iVar1;
  byte bVar2;
  undefined7 in_register_00000031;
  undefined2 in_register_0000008a;
  ushort local_1a;
  
  iVar1 = (*(this->super_I2Cgeneric)._vptr_I2Cgeneric[9])
                    (this,CONCAT71(in_register_00000031,regAddr),&local_1a,
                     (ulong)CONCAT22(in_register_0000008a,timeout));
  if ((char)iVar1 != '\0') {
    bVar2 = (bitStart - length) + 1;
    *data = ((ushort)(~(-1 << (length & 0x1f)) << (bVar2 & 0x1f)) & local_1a) >> (bVar2 & 0x1f);
  }
  return (char)iVar1;
}

Assistant:

int8_t I2Cdev::readBitsW(uint8_t regAddr, uint8_t bitStart, uint8_t length, uint16_t *data, uint16_t timeout) {
    // 1101011001101001 read byte
    // fedcba9876543210 bit numbers
    //    xxx           args: bitStart=12, length=3
    //    010           masked
    //           -> 010 shifted
    uint8_t count;
    uint16_t w;
    if ((count = this->readWord(regAddr, &w, timeout)) != 0) {
        uint16_t mask = ((1 << length) - 1) << (bitStart - length + 1);
        w &= mask;
        w >>= (bitStart - length + 1);
        *data = w;
    }
    return count;
}